

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,int>>>
::find_non_soo<std::vector<int,std::allocator<int>>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,int>>>
           *this,key_arg<std::vector<int>_> *key,size_t hash)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  bool bVar21;
  ushort uVar22;
  ctrl_t *pcVar23;
  ulong uVar24;
  ulong uVar25;
  anon_union_8_1_a8a14541_for_iterator_2 unaff_R13;
  uint uVar26;
  ulong uVar27;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  __m128i match;
  undefined1 auVar34 [16];
  iterator iVar35;
  char cVar28;
  char cVar31;
  char cVar32;
  char cVar33;
  
  uVar2 = *(ulong *)this;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar3 = *(ulong *)(this + 0x10);
  uVar25 = hash >> 7 ^ uVar3 >> 0xc;
  auVar29 = ZEXT416((CONCAT11((char)hash,(char)hash) & 0xff7f) & 0xffff7fff);
  auVar29 = pshuflw(auVar29,auVar29,0);
  uVar24 = 0;
  do {
    uVar25 = uVar25 & uVar2;
    pcVar1 = (char *)(uVar3 + uVar25);
    cVar5 = *pcVar1;
    cVar6 = pcVar1[1];
    cVar7 = pcVar1[2];
    cVar8 = pcVar1[3];
    cVar9 = pcVar1[4];
    cVar10 = pcVar1[5];
    cVar11 = pcVar1[6];
    cVar12 = pcVar1[7];
    cVar13 = pcVar1[8];
    cVar14 = pcVar1[9];
    cVar15 = pcVar1[10];
    cVar16 = pcVar1[0xb];
    cVar17 = pcVar1[0xc];
    cVar18 = pcVar1[0xd];
    cVar19 = pcVar1[0xe];
    cVar20 = pcVar1[0xf];
    cVar28 = auVar29[0];
    auVar30[0] = -(cVar28 == cVar5);
    cVar31 = auVar29[1];
    auVar30[1] = -(cVar31 == cVar6);
    cVar32 = auVar29[2];
    auVar30[2] = -(cVar32 == cVar7);
    cVar33 = auVar29[3];
    auVar30[3] = -(cVar33 == cVar8);
    auVar30[4] = -(cVar28 == cVar9);
    auVar30[5] = -(cVar31 == cVar10);
    auVar30[6] = -(cVar32 == cVar11);
    auVar30[7] = -(cVar33 == cVar12);
    auVar30[8] = -(cVar28 == cVar13);
    auVar30[9] = -(cVar31 == cVar14);
    auVar30[10] = -(cVar32 == cVar15);
    auVar30[0xb] = -(cVar33 == cVar16);
    auVar30[0xc] = -(cVar28 == cVar17);
    auVar30[0xd] = -(cVar31 == cVar18);
    auVar30[0xe] = -(cVar32 == cVar19);
    auVar30[0xf] = -(cVar33 == cVar20);
    uVar22 = (ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe | (ushort)(auVar30[0xf] >> 7) << 0xf;
    uVar26 = (uint)uVar22;
    while (uVar22 != 0) {
      uVar4 = 0;
      if (uVar26 != 0) {
        for (; (uVar26 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar27 = uVar4 + uVar25 & uVar2;
      unaff_R13.slot_ = (slot_type *)(uVar27 * 0x20);
      bVar21 = std::equal_to<std::vector<int,_std::allocator<int>_>_>::operator()
                         ((equal_to<std::vector<int,_std::allocator<int>_>_> *)this,
                          (vector<int,_std::allocator<int>_> *)
                          (*(long *)(this + 0x18) + (long)unaff_R13.slot_),key);
      if (bVar21) {
        if (*(long *)(this + 0x10) == 0) {
          __assert_fail("ctrl != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x9ef,
                        "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::vector<int>, int>, absl::hash_internal::Hash<std::vector<int>>, std::equal_to<std::vector<int>>, std::allocator<std::pair<const std::vector<int>, int>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::vector<int>, int>, Hash = absl::hash_internal::Hash<std::vector<int>>, Eq = std::equal_to<std::vector<int>>, Alloc = std::allocator<std::pair<const std::vector<int>, int>>]"
                       );
        }
        pcVar23 = (ctrl_t *)(*(long *)(this + 0x10) + uVar27);
        unaff_R13.slot_ = (slot_type *)((long)unaff_R13.slot_ + *(long *)(this + 0x18));
        goto LAB_001a0ee0;
      }
      uVar22 = (ushort)(uVar26 - 1) & (ushort)uVar26;
      uVar26 = CONCAT22((short)(uVar26 - 1 >> 0x10),uVar22);
    }
    auVar34[0] = -(cVar5 == -0x80);
    auVar34[1] = -(cVar6 == -0x80);
    auVar34[2] = -(cVar7 == -0x80);
    auVar34[3] = -(cVar8 == -0x80);
    auVar34[4] = -(cVar9 == -0x80);
    auVar34[5] = -(cVar10 == -0x80);
    auVar34[6] = -(cVar11 == -0x80);
    auVar34[7] = -(cVar12 == -0x80);
    auVar34[8] = -(cVar13 == -0x80);
    auVar34[9] = -(cVar14 == -0x80);
    auVar34[10] = -(cVar15 == -0x80);
    auVar34[0xb] = -(cVar16 == -0x80);
    auVar34[0xc] = -(cVar17 == -0x80);
    auVar34[0xd] = -(cVar18 == -0x80);
    auVar34[0xe] = -(cVar19 == -0x80);
    auVar34[0xf] = -(cVar20 == -0x80);
    if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar34 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar34 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar34 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar34 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar34 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar34 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar34 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar34 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar34 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar34 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar34 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar20 == -0x80) {
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_int>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_int>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                  *)this);
      pcVar23 = (ctrl_t *)0x0;
LAB_001a0ee0:
      iVar35.field_1 =
           (anon_union_8_1_a8a14541_for_iterator_2)
           (anon_union_8_1_a8a14541_for_iterator_2)unaff_R13.slot_;
      iVar35.ctrl_ = pcVar23;
      return iVar35;
    }
    uVar25 = uVar25 + uVar24 + 0x10;
    uVar24 = uVar24 + 0x10;
    if (*(ulong *)this < uVar24) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe37,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::vector<int>, int>, absl::hash_internal::Hash<std::vector<int>>, std::equal_to<std::vector<int>>, std::allocator<std::pair<const std::vector<int>, int>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<std::vector<int>, int>, Hash = absl::hash_internal::Hash<std::vector<int>>, Eq = std::equal_to<std::vector<int>>, Alloc = std::allocator<std::pair<const std::vector<int>, int>>, K = std::vector<int>]"
                   );
    }
  } while( true );
}

Assistant:

iterator find_non_soo(const key_arg<K>& key, size_t hash) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return iterator_at(seq.offset(i));
      }
      if (ABSL_PREDICT_TRUE(g.MaskEmpty())) return end();
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }